

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O1

void __thiscall edk2_vss2_t::vss2_variable_t::_read(vss2_variable_t *this)

{
  edk2_vss2_t *peVar1;
  vss2_variable_attributes_t *pvVar2;
  kstream *pkVar3;
  uint8_t uVar4;
  bool bVar5;
  uint32_t uVar6;
  int32_t iVar7;
  int iVar8;
  vss2_variable_attributes_t *this_00;
  uint64_t uVar9;
  validation_expr_error<unsigned_char> *this_01;
  string local_60;
  string local_40;
  
  this->n_invoke_offset = true;
  if (this->f_offset == true) {
    iVar8 = this->m_offset;
  }
  else {
    uVar9 = kaitai::kstream::pos((this->super_kstruct).m__io);
    iVar8 = (int)uVar9;
    this->m_offset = iVar8;
    this->f_offset = true;
  }
  if (-1 < iVar8) {
    this->n_invoke_offset = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_offset,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p));
    }
  }
  uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_signature_first = uVar4;
  this->n_signature_last = true;
  if (uVar4 == 0xaa) {
    this->n_signature_last = false;
    uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_signature_last = uVar4;
    if (uVar4 != 'U') {
      this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
      local_60._M_dataplus._M_p._0_1_ = this->m_signature_last;
      pkVar3 = (this->super_kstruct).m__io;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"/types/vss2_variable/seq/2","");
      kaitai::validation_expr_error<unsigned_char>::validation_expr_error
                (this_01,(uchar *)&local_60,pkVar3,&local_40);
      __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
  }
  this->n_state = true;
  if (this->m_signature_first == 0xaa) {
    this->n_state = false;
    uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar4;
  }
  this->n_reserved = true;
  if (this->m_signature_first == 0xaa) {
    this->n_reserved = false;
    uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_reserved = uVar4;
  }
  this->n_attributes = true;
  if (this->m_signature_first == 0xaa) {
    this->n_attributes = false;
    this_00 = (vss2_variable_attributes_t *)operator_new(0x30);
    peVar1 = this->m__root;
    (this_00->super_kstruct).m__io = (this->super_kstruct).m__io;
    (this_00->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__vss2_variable_attributes_t_001a9dd0
    ;
    this_00->m__parent = this;
    this_00->m__root = peVar1;
    vss2_variable_attributes_t::_read(this_00);
    pvVar2 = (this->m_attributes)._M_t.
             super___uniq_ptr_impl<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
             .super__Head_base<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_false>._M_head_impl;
    (this->m_attributes)._M_t.
    super___uniq_ptr_impl<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
    .super__Head_base<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_false>._M_head_impl = this_00;
    if (pvVar2 != (vss2_variable_attributes_t *)0x0) {
      (**(code **)((long)(pvVar2->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_len_name = true;
  if (this->m_signature_first == 0xaa) {
    this->n_len_name = false;
    uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_name = uVar6;
  }
  this->n_len_data = true;
  if (this->m_signature_first == 0xaa) {
    this->n_len_data = false;
    uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data = uVar6;
  }
  this->n_timestamp = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_timestamp = false;
      kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0x10);
      std::__cxx11::string::operator=((string *)&this->m_timestamp,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  this->n_pubkey_index = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_pubkey_index = false;
      uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_pubkey_index = uVar6;
    }
  }
  this->n_len_name_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_len_name_auth = false;
      uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_name_auth = uVar6;
    }
  }
  this->n_len_data_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_len_data_auth = false;
      uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_data_auth = uVar6;
    }
  }
  this->n_vendor_guid = true;
  if (this->m_signature_first == 0xaa) {
    this->n_vendor_guid = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0x10);
    std::__cxx11::string::operator=((string *)&this->m_vendor_guid,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p));
    }
  }
  this->n_name_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_name_auth = false;
      kaitai::kstream::read_bytes_abi_cxx11_
                (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_name_auth);
      std::__cxx11::string::operator=((string *)&this->m_name_auth,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  this->n_data_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_data_auth = false;
      kaitai::kstream::read_bytes_abi_cxx11_
                (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_data_auth);
      std::__cxx11::string::operator=((string *)&this->m_data_auth,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  this->n_invoke_end_offset_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      if (this->f_end_offset_auth == true) {
        iVar8 = this->m_end_offset_auth;
      }
      else {
        uVar9 = kaitai::kstream::pos((this->super_kstruct).m__io);
        iVar8 = (int)uVar9;
        this->m_end_offset_auth = iVar8;
        this->f_end_offset_auth = true;
      }
      if (-1 < iVar8) {
        this->n_invoke_end_offset_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0);
        std::__cxx11::string::operator=
                  ((string *)&this->m_invoke_end_offset_auth,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
            &local_60.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                   (uint8_t)local_60._M_dataplus._M_p));
        }
      }
    }
  }
  this->n_alignment_padding_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (bVar5) {
      this->n_alignment_padding_auth = false;
      pkVar3 = (this->super_kstruct).m__io;
      iVar7 = len_alignment_padding_auth(this);
      kaitai::kstream::read_bytes_abi_cxx11_(&local_60,pkVar3,(long)iVar7);
      std::__cxx11::string::operator=((string *)&this->m_alignment_padding_auth,(string *)&local_60)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  this->n_name = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (!bVar5) {
      this->n_name = false;
      kaitai::kstream::read_bytes_abi_cxx11_
                (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_name);
      std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  this->n_data = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (!bVar5) {
      this->n_data = false;
      kaitai::kstream::read_bytes_abi_cxx11_
                (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_data);
      std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  this->n_invoke_end_offset = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (!bVar5) {
      if (this->f_end_offset == true) {
        iVar8 = this->m_end_offset;
      }
      else {
        uVar9 = kaitai::kstream::pos((this->super_kstruct).m__io);
        iVar8 = (int)uVar9;
        this->m_end_offset = iVar8;
        this->f_end_offset = true;
      }
      if (-1 < iVar8) {
        this->n_invoke_end_offset = false;
        kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0);
        std::__cxx11::string::operator=((string *)&this->m_invoke_end_offset,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
            &local_60.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                   (uint8_t)local_60._M_dataplus._M_p));
        }
      }
    }
  }
  this->n_alignment_padding = true;
  if (this->m_signature_first == 0xaa) {
    bVar5 = is_auth(this);
    if (!bVar5) {
      this->n_alignment_padding = false;
      pkVar3 = (this->super_kstruct).m__io;
      iVar7 = len_alignment_padding(this);
      kaitai::kstream::read_bytes_abi_cxx11_(&local_60,pkVar3,(long)iVar7);
      std::__cxx11::string::operator=((string *)&this->m_alignment_padding,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(uint8_t)local_60._M_dataplus._M_p)
                       );
      }
    }
  }
  return;
}

Assistant:

void edk2_vss2_t::vss2_variable_t::_read() {
    n_invoke_offset = true;
    if (offset() >= 0) {
        n_invoke_offset = false;
        m_invoke_offset = m__io->read_bytes(0);
    }
    m_signature_first = m__io->read_u1();
    n_signature_last = true;
    if (signature_first() == 170) {
        n_signature_last = false;
        m_signature_last = m__io->read_u1();
        {
            uint8_t _ = signature_last();
            if (!(_ == 85)) {
                throw kaitai::validation_expr_error<uint8_t>(signature_last(), _io(), std::string("/types/vss2_variable/seq/2"));
            }
        }
    }
    n_state = true;
    if (signature_first() == 170) {
        n_state = false;
        m_state = m__io->read_u1();
    }
    n_reserved = true;
    if (signature_first() == 170) {
        n_reserved = false;
        m_reserved = m__io->read_u1();
    }
    n_attributes = true;
    if (signature_first() == 170) {
        n_attributes = false;
        m_attributes = std::unique_ptr<vss2_variable_attributes_t>(new vss2_variable_attributes_t(m__io, this, m__root));
    }
    n_len_name = true;
    if (signature_first() == 170) {
        n_len_name = false;
        m_len_name = m__io->read_u4le();
    }
    n_len_data = true;
    if (signature_first() == 170) {
        n_len_data = false;
        m_len_data = m__io->read_u4le();
    }
    n_timestamp = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_timestamp = false;
        m_timestamp = m__io->read_bytes(16);
    }
    n_pubkey_index = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_pubkey_index = false;
        m_pubkey_index = m__io->read_u4le();
    }
    n_len_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_name_auth = false;
        m_len_name_auth = m__io->read_u4le();
    }
    n_len_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_data_auth = false;
        m_len_data_auth = m__io->read_u4le();
    }
    n_vendor_guid = true;
    if (signature_first() == 170) {
        n_vendor_guid = false;
        m_vendor_guid = m__io->read_bytes(16);
    }
    n_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_name_auth = false;
        m_name_auth = m__io->read_bytes(len_name_auth());
    }
    n_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_data_auth = false;
        m_data_auth = m__io->read_bytes(len_data_auth());
    }
    n_invoke_end_offset_auth = true;
    if ( ((signature_first() == 170) && (is_auth()) && (end_offset_auth() >= 0)) ) {
        n_invoke_end_offset_auth = false;
        m_invoke_end_offset_auth = m__io->read_bytes(0);
    }
    n_alignment_padding_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_alignment_padding_auth = false;
        m_alignment_padding_auth = m__io->read_bytes(len_alignment_padding_auth());
    }
    n_name = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_name = false;
        m_name = m__io->read_bytes(len_name());
    }
    n_data = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_data = false;
        m_data = m__io->read_bytes(len_data());
    }
    n_invoke_end_offset = true;
    if ( ((signature_first() == 170) && (!(is_auth())) && (end_offset() >= 0)) ) {
        n_invoke_end_offset = false;
        m_invoke_end_offset = m__io->read_bytes(0);
    }
    n_alignment_padding = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_alignment_padding = false;
        m_alignment_padding = m__io->read_bytes(len_alignment_padding());
    }
}